

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.h
# Opt level: O0

bool __thiscall
trieste::
Process<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::PassDef>_*,_std::vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>_>_>
::validate(Process<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::PassDef>_*,_std::vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>_>_>
           *this,Node *ast,Nodes *errors)

{
  bool bVar1;
  Wellformed *pWVar2;
  element_type *this_00;
  bool local_94;
  bool local_93;
  bool local_92;
  bool local_7a;
  shared_ptr<trieste::NodeDef> local_78 [2];
  bool local_51;
  undefined1 local_50 [7];
  bool ok;
  Wellformed wf;
  Nodes *errors_local;
  Node *ast_local;
  Process<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::PassDef>_*,_std::vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>_>_>
  *this_local;
  
  wf.shapes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)errors;
  pWVar2 = PassRange<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::PassDef>_*,_std::vector<std::shared_ptr<trieste::PassDef>,_std::allocator<std::shared_ptr<trieste::PassDef>_>_>_>_>
           ::input_wf(&this->pass_range);
  trieste::wf::Wellformed::Wellformed((Wellformed *)local_50,pWVar2);
  local_51 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)ast);
  local_7a = false;
  if (local_51) {
    local_7a = trieste::wf::Wellformed::build_st((Wellformed *)local_50,ast);
  }
  local_51 = local_7a;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)ast);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)ast);
    NodeDef::get_errors(this_00,(Nodes *)wf.shapes._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
  }
  local_92 = false;
  if ((local_51 & 1U) != 0) {
    local_92 = std::
               vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ::empty((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        *)wf.shapes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  local_51 = local_92;
  bVar1 = false;
  local_93 = false;
  if (local_92 != false) {
    bVar1 = (this->check_well_formed & 1U) != 0;
    local_94 = true;
    if (bVar1) {
      std::shared_ptr<trieste::NodeDef>::shared_ptr(local_78,ast);
      local_94 = trieste::wf::Wellformed::check((Wellformed *)local_50,local_78);
    }
    local_93 = local_94;
  }
  local_51 = local_93;
  if (bVar1) {
    std::shared_ptr<trieste::NodeDef>::~shared_ptr(local_78);
  }
  bVar1 = local_51;
  trieste::wf::Wellformed::~Wellformed((Wellformed *)local_50);
  return (bool)(bVar1 & 1);
}

Assistant:

bool validate(Node ast, Nodes& errors)
    {
      auto wf = pass_range.input_wf();
      auto ok = bool(ast);

      ok = ok && wf.build_st(ast);
      
      if (ast)
        ast->get_errors(errors);
      ok = ok && errors.empty();
      
      ok = ok && (!check_well_formed || wf.check(ast));

      return ok;
    }